

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.hpp
# Opt level: O1

Path<SimpleState_*> * __thiscall
xmotion::AStar::Search<SimpleState*,double,SimpleStateIndexer,int>
          (Path<SimpleState_*> *__return_storage_ptr__,AStar *this,
          Graph<SimpleState_*,_double,_SimpleStateIndexer> *graph,int start,int goal,
          CalcHeuristicFunc_t<SimpleState_*,_double> *calc_heuristic)

{
  pointer *pppSVar1;
  undefined8 *puVar2;
  long lVar3;
  ulong uVar4;
  SimpleState **__args;
  iterator __position;
  ulong uVar5;
  undefined4 in_register_00000084;
  long *plVar6;
  long *plVar7;
  _Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
  start_vtx;
  vertex_iterator *wp;
  pointer pvVar8;
  long *plVar9;
  Graph<SimpleState_*,_double,_SimpleStateIndexer> *graph_00;
  vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  path_vtx;
  GetNeighbourFunc_t<SimpleState_*,_double> *in_stack_ffffffffffffff78;
  vector<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
  local_80;
  _Any_data local_68;
  code *local_58;
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  
  for (puVar2 = *(undefined8 **)(this + 0x18); puVar2 != (undefined8 *)0x0;
      puVar2 = (undefined8 *)*puVar2) {
    lVar3 = puVar2[2];
    *(undefined2 *)(lVar3 + 0x48) = 0;
    *(undefined8 *)(lVar3 + 0x68) = 0;
    *(undefined8 *)(lVar3 + 0x50) = 0x7fefffffffffffff;
    *(undefined8 *)(lVar3 + 0x58) = 0x7fefffffffffffff;
    *(undefined8 *)(lVar3 + 0x60) = 0x7fefffffffffffff;
  }
  uVar5 = (ulong)(int)graph;
  uVar4 = *(ulong *)(this + 0x10);
  plVar6 = *(long **)(*(long *)(this + 8) + (uVar5 % uVar4) * 8);
  plVar7 = (long *)0x0;
  if ((plVar6 != (long *)0x0) && (plVar9 = (long *)*plVar6, plVar7 = plVar6, plVar9[1] != uVar5)) {
    while (plVar6 = (long *)*plVar9, plVar6 != (long *)0x0) {
      plVar7 = (long *)0x0;
      if (((ulong)plVar6[1] % uVar4 != uVar5 % uVar4) ||
         (plVar7 = plVar9, plVar9 = plVar6, plVar6[1] == uVar5)) goto LAB_00101dda;
    }
    plVar7 = (long *)0x0;
  }
LAB_00101dda:
  if (plVar7 == (long *)0x0) {
    graph_00 = (Graph<SimpleState_*,_double,_SimpleStateIndexer> *)0x0;
  }
  else {
    graph_00 = (Graph<SimpleState_*,_double,_SimpleStateIndexer> *)*plVar7;
  }
  uVar5 = (ulong)start;
  plVar6 = *(long **)(*(long *)(this + 8) + (uVar5 % uVar4) * 8);
  plVar7 = (long *)0x0;
  if ((plVar6 != (long *)0x0) &&
     (plVar9 = (long *)*plVar6, plVar7 = plVar6, ((long *)*plVar6)[1] != uVar5)) {
    while (plVar6 = plVar9, plVar9 = (long *)*plVar6, plVar9 != (long *)0x0) {
      plVar7 = (long *)0x0;
      if (((ulong)plVar9[1] % uVar4 != uVar5 % uVar4) || (plVar7 = plVar6, plVar9[1] == uVar5))
      goto LAB_00101e3d;
    }
    plVar7 = (long *)0x0;
  }
LAB_00101e3d:
  if (plVar7 == (long *)0x0) {
    start_vtx._M_cur = (__node_type *)0x0;
  }
  else {
    start_vtx._M_cur = (__node_type *)*plVar7;
  }
  (__return_storage_ptr__->super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((graph_00 != (Graph<SimpleState_*,_double,_SimpleStateIndexer> *)0x0) &&
     ((VertexMapTypeIterator)start_vtx._M_cur != (__node_type *)0x0)) {
    std::function<double_(SimpleState_*,_SimpleState_*)>::function
              ((function<double_(SimpleState_*,_SimpleState_*)> *)&local_68,
               (function<double_(SimpleState_*,_SimpleState_*)> *)
               CONCAT44(in_register_00000084,goal));
    local_38 = (code *)0x0;
    uStack_30 = 0;
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    PerformSearch<SimpleState*,double,SimpleStateIndexer>
              (&local_80,this,graph_00,(vertex_iterator)start_vtx._M_cur,(vertex_iterator)&local_68,
               (CalcHeuristicFunc_t<SimpleState_*,_double> *)&local_48,in_stack_ffffffffffffff78);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    pvVar8 = local_80.
             super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
      pvVar8 = local_80.
               super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    for (; pvVar8 != local_80.
                     super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
                     ._M_impl.super__Vector_impl_data._M_finish; pvVar8 = pvVar8 + 1) {
      __args = *(SimpleState ***)
                ((long)&(((pvVar8->super_const_vertex_iterator).super_VertexMapTypeIterator.
                          super__Node_iterator_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
                         ._M_cur)->
                        super__Hash_node_value<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>,_false>
                        ).
                        super__Hash_node_value_base<std::pair<const_long,_xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Vertex_*>_>
                        ._M_storage._M_storage + 8);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<SimpleState*,std::allocator<SimpleState*>>::
        _M_realloc_insert<SimpleState*const&>
                  ((vector<SimpleState*,std::allocator<SimpleState*>> *)__return_storage_ptr__,
                   __position,__args);
      }
      else {
        *__position._M_current = *__args;
        pppSVar1 = &(__return_storage_ptr__->
                    super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppSVar1 = *pppSVar1 + 1;
      }
    }
    if (local_80.
        super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_80.
                      super__Vector_base<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator,_std::allocator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::vertex_iterator>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static Path<State> Search(
      Graph<State, Transition, StateIndexer> *graph, VertexIdentifier start,
      VertexIdentifier goal,
      CalcHeuristicFunc_t<State, Transition> calc_heuristic) {
    // reset last search information
    graph->ResetAllVertices();

    auto start_it = graph->FindVertex(start);
    auto goal_it = graph->FindVertex(goal);

    Path<State> path;
    // start a new search and return result
    if (start_it != graph->vertex_end() && goal_it != graph->vertex_end()) {
      auto path_vtx = PerformSearch(graph, start_it, goal_it, calc_heuristic);
      for (auto &wp : path_vtx) path.push_back(wp->state);
    }
    return path;
  }